

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O3

void __thiscall re2::DFA::RunWorkqOnEmptyString(DFA *this,Workq *oldq,Workq *newq,uint flag)

{
  int id;
  int *piVar1;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  if ((oldq->super_SparseSet).size_ != 0) {
    piVar1 = (oldq->super_SparseSet).dense_;
    do {
      id = *piVar1;
      if (oldq->n_ <= id) {
        id = -1;
      }
      AddToQueue(this,newq,id,flag);
      piVar1 = piVar1 + 1;
    } while (piVar1 != (oldq->super_SparseSet).dense_ + (oldq->super_SparseSet).size_);
  }
  return;
}

Assistant:

void clear() { size_ = 0; }